

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void leaveblock(FuncState *fs)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  LexState *ls;
  BlockCnt *pBVar8;
  Vardesc *pVVar9;
  Dyndata *pDVar10;
  LexState *ls_00;
  Labeldesc *pLVar11;
  Dyndata *pDVar12;
  FuncState *fs_00;
  Instruction *pIVar13;
  undefined8 uVar14;
  uint uVar15;
  TString *name;
  Labeldesc *pLVar16;
  byte bVar17;
  long lVar18;
  ulong uVar19;
  byte unaff_BL;
  int iVar20;
  long lVar21;
  LocVar *pLVar22;
  byte bVar23;
  Proto *in_R8;
  
  ls = fs->ls;
  pBVar8 = fs->bl;
  uVar15 = (uint)pBVar8->nactvar;
  do {
    if ((int)uVar15 < 1) {
      unaff_BL = 0;
      break;
    }
    pVVar9 = (ls->dyd->actvar).arr;
    lVar18 = (long)(int)(fs->firstlocal + uVar15 + -1);
    cVar4 = *(char *)((long)pVVar9 + lVar18 * 0x18 + 9);
    if (cVar4 != '\x03') {
      unaff_BL = (&pVVar9->vd)[lVar18].ridx + 1;
    }
    uVar15 = uVar15 - 1;
  } while (cVar4 == '\x03');
  if ((pBVar8->previous != (BlockCnt *)0x0) && (pBVar8->upval != '\0')) {
    in_R8 = (Proto *)0x0;
    luaK_codeABCk(fs,OP_CLOSE,(uint)unaff_BL,0,0,0);
  }
  fs->freereg = unaff_BL;
  bVar23 = pBVar8->nactvar;
  bVar17 = fs->nactvar;
  pDVar10 = fs->ls->dyd;
  piVar1 = &(pDVar10->actvar).n;
  *piVar1 = *piVar1 + ((uint)bVar23 - (uint)bVar17);
  if (bVar23 < bVar17) {
    pVVar9 = (pDVar10->actvar).arr;
    iVar20 = (bVar17 - 1 & 0xff) + fs->firstlocal;
    do {
      bVar17 = bVar17 - 1;
      fs->nactvar = bVar17;
      if (*(char *)((long)pVVar9 + (long)iVar20 * 0x18 + 9) == '\x03') {
        pLVar22 = (LocVar *)0x0;
      }
      else {
        in_R8 = fs->f;
        pLVar22 = in_R8->locvars + (&pVVar9->vd)[iVar20].pidx;
      }
      if (pLVar22 != (LocVar *)0x0) {
        in_R8 = (Proto *)(ulong)(uint)fs->pc;
        pLVar22->endpc = fs->pc;
      }
      iVar20 = iVar20 + -1;
    } while (bVar23 < bVar17);
  }
  if (pBVar8->isloop == '\x02') {
    name = luaS_newlstr(ls->L,"break",5);
    pDVar10 = ls->dyd;
    uVar15 = luaK_getlabel(ls->fs);
    in_R8 = (Proto *)(ulong)uVar15;
    newlabelentry(ls,&pDVar10->label,name,0,uVar15);
  }
  ls_00 = fs->ls;
  pDVar10 = ls_00->dyd;
  uVar15 = (uint)pBVar8->nactvar;
  do {
    if ((int)uVar15 < 1) {
      bVar23 = 0;
      break;
    }
    pVVar9 = (pDVar10->actvar).arr;
    lVar18 = (long)(int)(fs->firstlocal + uVar15 + -1);
    cVar4 = *(char *)((long)pVVar9 + lVar18 * 0x18 + 9);
    if (cVar4 != '\x03') {
      in_R8 = (Proto *)(ulong)(byte)((&pVVar9->vd)[lVar18].ridx + 1);
    }
    bVar23 = (byte)in_R8;
    uVar15 = uVar15 - 1;
  } while (cVar4 == '\x03');
  iVar20 = pBVar8->firstgoto;
  if (iVar20 < (pDVar10->gt).n) {
    do {
      pLVar11 = (pDVar10->gt).arr;
      lVar18 = (long)iVar20;
      uVar19 = lVar18 * 3;
      iVar6 = pBVar8->firstlabel;
      pDVar12 = ls_00->dyd;
      iVar7 = (pDVar12->label).n;
      if (iVar6 < iVar7) {
        lVar21 = (long)iVar7 - (long)iVar6;
        pLVar16 = (pDVar12->label).arr + iVar6;
        do {
          if (pLVar16->name == pLVar11[lVar18].name) goto LAB_00115e06;
          pLVar16 = pLVar16 + 1;
          lVar21 = lVar21 + -1;
        } while (lVar21 != 0);
      }
      pLVar16 = (Labeldesc *)0x0;
LAB_00115e06:
      if (pLVar16 == (Labeldesc *)0x0) {
        if (pBVar8->upval != '\0') {
          uVar15 = (uint)pLVar11[lVar18].nactvar;
          do {
            if ((int)uVar15 < 1) {
              bVar17 = 0;
              break;
            }
            pVVar9 = (fs->ls->dyd->actvar).arr;
            lVar21 = (long)(int)(fs->firstlocal + uVar15 + -1);
            cVar4 = *(char *)((long)pVVar9 + lVar21 * 0x18 + 9);
            if (cVar4 != '\x03') {
              uVar19 = (ulong)(byte)((&pVVar9->vd)[lVar21].ridx + 1);
            }
            bVar17 = (byte)uVar19;
            uVar15 = uVar15 - 1;
          } while (cVar4 == '\x03');
          if (bVar23 < bVar17) {
            pLVar11[lVar18].close = '\x01';
          }
        }
        pLVar11[lVar18].nactvar = pBVar8->nactvar;
        iVar20 = iVar20 + 1;
      }
      else {
        pLVar11 = (pDVar12->gt).arr + lVar18;
        bVar17 = pLVar11->nactvar;
        bVar5 = pLVar16->nactvar;
        uVar15 = (uint)bVar5;
        if (bVar17 < bVar5) {
          jumpscopeerror(ls_00,pLVar11);
        }
        fs_00 = ls_00->fs;
        if ((pLVar11->close != '\0') || ((pBVar8->upval != '\0' && (bVar5 < bVar17)))) {
          do {
            if ((int)uVar15 < 1) {
              bVar17 = 0;
              break;
            }
            pVVar9 = (fs_00->ls->dyd->actvar).arr;
            lVar21 = (long)(int)(fs_00->firstlocal + uVar15 + -1);
            cVar4 = *(char *)((long)pVVar9 + lVar21 * 0x18 + 9);
            if (cVar4 != '\x03') {
              bVar17 = (&pVVar9->vd)[lVar21].ridx + 1;
            }
            uVar15 = uVar15 - 1;
          } while (cVar4 == '\x03');
          pIVar13 = fs_00->f->code;
          pIVar13[(long)pLVar11->pc + 1] = pIVar13[pLVar11->pc];
          pIVar13[pLVar11->pc] = (uint)bVar17 << 7 | 0x36;
          pLVar11->pc = pLVar11->pc + 1;
        }
        luaK_patchlist(fs_00,pLVar11->pc,pLVar16->pc);
        uVar15 = (pDVar12->gt).n - 1;
        uVar19 = (ulong)uVar15;
        if (iVar20 < (int)uVar15) {
          lVar21 = lVar18 * 0x18;
          do {
            pLVar11 = (pDVar12->gt).arr;
            lVar18 = lVar18 + 1;
            *(undefined8 *)(&pLVar11->nactvar + lVar21) =
                 *(undefined8 *)(&pLVar11[1].nactvar + lVar21);
            puVar3 = (undefined8 *)((long)&pLVar11[1].name + lVar21);
            uVar14 = puVar3[1];
            puVar2 = (undefined8 *)((long)&pLVar11->name + lVar21);
            *puVar2 = *puVar3;
            puVar2[1] = uVar14;
            uVar19 = (long)(pDVar12->gt).n - 1;
            lVar21 = lVar21 + 0x18;
          } while (lVar18 < (long)uVar19);
        }
        (pDVar12->gt).n = (int)uVar19;
      }
    } while (iVar20 < (pDVar10->gt).n);
  }
  (ls_00->dyd->label).n = pBVar8->firstlabel;
  if (pBVar8->previous == (BlockCnt *)0x0) {
    if (pBVar8->firstgoto < (ls->dyd->gt).n) {
      undefgoto(ls,(ls->dyd->gt).arr + pBVar8->firstgoto);
    }
  }
  fs->bl = pBVar8->previous;
  return;
}

Assistant:

static void leaveblock (FuncState *fs) {
  BlockCnt *bl = fs->bl;
  LexState *ls = fs->ls;
  lu_byte stklevel = reglevel(fs, bl->nactvar);  /* level outside block */
  if (bl->previous && bl->upval)  /* need a 'close'? */
    luaK_codeABC(fs, OP_CLOSE, stklevel, 0, 0);
  fs->freereg = stklevel;  /* free registers */
  removevars(fs, bl->nactvar);  /* remove block locals */
  lua_assert(bl->nactvar == fs->nactvar);  /* back to level on entry */
  if (bl->isloop == 2)  /* has to fix pending breaks? */
    createlabel(ls, luaS_newliteral(ls->L, "break"), 0, 0);
  solvegotos(fs, bl);
  if (bl->previous == NULL) {  /* was it the last block? */
    if (bl->firstgoto < ls->dyd->gt.n)  /* still pending gotos? */
      undefgoto(ls, &ls->dyd->gt.arr[bl->firstgoto]);  /* error */
  }
  fs->bl = bl->previous;  /* current block now is previous one */
}